

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O3

void __thiscall
cppcms::impl::tcp_cache::store
          (tcp_cache *this,string *key,string *a,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *triggers,time_t timeout)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  messenger *this_00;
  int iVar3;
  string data;
  tcp_operation_header h;
  string local_88;
  tcp_operation_header local_68;
  tcp_connector *local_38;
  
  local_68.operations.fetch.current_gen = 0;
  local_68.operations.data.timeout = 0;
  local_68.filler[0] = 0;
  local_68.filler[1] = 0;
  local_68.operations._16_8_ = 0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_68.opcode = 3;
  local_68.size = 0;
  std::__cxx11::string::_M_append((char *)&local_88,(ulong)(key->_M_dataplus)._M_p);
  local_68.operations.fetch.key_len = (int)key->_M_string_length;
  std::__cxx11::string::_M_append((char *)&local_88,(ulong)(a->_M_dataplus)._M_p);
  local_68.operations.store.data_len = (int)a->_M_string_length;
  iVar3 = 0;
  p_Var2 = (triggers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &this->super_tcp_connector;
  local_68.operations.store.timeout = timeout;
  for (; (_Rb_tree_header *)p_Var2 != &(triggers->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_parent;
    std::__cxx11::string::append((char *)&local_88,*(ulong *)(p_Var2 + 1));
    iVar3 = iVar3 + (int)p_Var1 + 1;
  }
  local_68.operations.data.triggers_len = (uint32_t)((ulong)local_68.operations._16_8_ >> 0x20);
  local_68.operations.store.triggers_len = iVar3;
  local_68.size = (uint32_t)local_88._M_string_length;
  this_00 = tcp_connector::get(local_38,key);
  messenger::transmit(this_00,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void tcp_cache::store(	std::string const &key,
			std::string const &a,
			std::set<std::string> const &triggers,
			time_t timeout)
{
	tcp_operation_header h=tcp_operation_header();
	std::string data;
	h.opcode=opcodes::store;
	data.append(key);
	h.operations.store.key_len=key.size();
	data.append(a);
	h.operations.store.data_len=a.size();
	h.operations.store.timeout=timeout;
	unsigned tlen=0;
	for(std::set<std::string>::const_iterator p=triggers.begin(),e=triggers.end();p!=e;++p) {
		tlen+=p->size()+1;
		data.append(p->c_str(),p->size()+1);
	}
	h.operations.store.triggers_len=tlen;
	h.size=data.size();
	get(key).transmit(h,data);
}